

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O0

ExprBase * AnalyzeDereference(ExpressionContext *ctx,SynDereference *syntax)

{
  bool bVar1;
  ExprBase *value_00;
  TypeBase *type_00;
  TypeRef *pTVar2;
  TypeClass *pTVar3;
  TypeClass *typeClass;
  TypeRef *type;
  ExprBase *value;
  SynDereference *syntax_local;
  ExpressionContext *ctx_local;
  
  value_00 = AnalyzeExpression(ctx,syntax->value);
  bVar1 = isType<TypeError>(value_00->type);
  if (bVar1) {
    ctx_local = (ExpressionContext *)ExpressionContext::get<ExprDereference>(ctx);
    type_00 = &ExpressionContext::GetErrorType(ctx)->super_TypeBase;
    ExprDereference::ExprDereference
              ((ExprDereference *)ctx_local,&syntax->super_SynBase,type_00,value_00);
  }
  else {
    pTVar2 = getType<TypeRef>(value_00->type);
    if (pTVar2 == (TypeRef *)0x0) {
      bVar1 = isType<TypeAutoRef>(value_00->type);
      if (bVar1) {
        bVar1 = isType<ExprUnboxing>(value_00);
        if (bVar1) {
          anon_unknown.dwarf_6f1cc::Stop
                    (ctx,&syntax->super_SynBase,"ERROR: cannot dereference value of unknown type");
        }
        ctx_local = (ExpressionContext *)ExpressionContext::get<ExprUnboxing>(ctx);
        ExprUnboxing::ExprUnboxing
                  ((ExprUnboxing *)ctx_local,&syntax->super_SynBase,
                   &ctx->typeAutoRef->super_TypeBase,value_00);
      }
      else {
        anon_unknown.dwarf_6f1cc::Stop
                  (ctx,&syntax->super_SynBase,
                   "ERROR: cannot dereference type \'%.*s\' that is not a pointer",
                   (ulong)(uint)((int)(value_00->type->name).end - (int)(value_00->type->name).begin
                                ),(value_00->type->name).begin);
        ctx_local = (ExpressionContext *)0x0;
      }
    }
    else {
      bVar1 = isType<TypeVoid>(pTVar2->subType);
      if (bVar1) {
        anon_unknown.dwarf_6f1cc::Stop
                  (ctx,&syntax->super_SynBase,"ERROR: cannot dereference type \'%.*s\'",
                   (ulong)(uint)((int)(value_00->type->name).end - (int)(value_00->type->name).begin
                                ),(value_00->type->name).begin);
      }
      pTVar3 = getType<TypeClass>(pTVar2->subType);
      if ((pTVar3 != (TypeClass *)0x0) && ((pTVar3->completed & 1U) == 0)) {
        anon_unknown.dwarf_6f1cc::Stop
                  (ctx,&syntax->super_SynBase,"ERROR: type \'%.*s\' is not fully defined",
                   (ulong)(uint)((int)(pTVar3->super_TypeStruct).super_TypeBase.name.end -
                                (int)(pTVar3->super_TypeStruct).super_TypeBase.name.begin),
                   (pTVar3->super_TypeStruct).super_TypeBase.name.begin);
      }
      ctx_local = (ExpressionContext *)ExpressionContext::get<ExprDereference>(ctx);
      ExprDereference::ExprDereference
                ((ExprDereference *)ctx_local,&syntax->super_SynBase,pTVar2->subType,value_00);
    }
  }
  return (ExprBase *)ctx_local;
}

Assistant:

ExprBase* AnalyzeDereference(ExpressionContext &ctx, SynDereference *syntax)
{
	ExprBase *value = AnalyzeExpression(ctx, syntax->value);

	if(isType<TypeError>(value->type))
		return new (ctx.get<ExprDereference>()) ExprDereference(syntax, ctx.GetErrorType(), value);

	if(TypeRef *type = getType<TypeRef>(value->type))
	{
		if(isType<TypeVoid>(type->subType))
			Stop(ctx, syntax, "ERROR: cannot dereference type '%.*s'", FMT_ISTR(value->type->name));

		if(TypeClass *typeClass = getType<TypeClass>(type->subType))
		{
			if(!typeClass->completed)
				Stop(ctx, syntax, "ERROR: type '%.*s' is not fully defined", FMT_ISTR(typeClass->name));
		}

		return new (ctx.get<ExprDereference>()) ExprDereference(syntax, type->subType, value);
	}

	if(isType<TypeAutoRef>(value->type))
	{
		if(isType<ExprUnboxing>(value))
			Stop(ctx, syntax, "ERROR: cannot dereference value of unknown type");

		return new (ctx.get<ExprUnboxing>()) ExprUnboxing(syntax, ctx.typeAutoRef, value);
	}

	Stop(ctx, syntax, "ERROR: cannot dereference type '%.*s' that is not a pointer", FMT_ISTR(value->type->name));

	return NULL;
}